

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>::rehash
          (SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U> *this)

{
  uint uVar1;
  TypeBase **ppTVar2;
  Allocator *pAVar3;
  int iVar4;
  undefined4 extraout_var;
  TypeBase **dst;
  long lVar5;
  
  uVar1 = this->bucketCount;
  ppTVar2 = this->data;
  this->bucketCount = uVar1 * 2;
  if (this->allocator == (Allocator *)0x0) {
    dst = (TypeBase **)(*(code *)NULLC::alloc)(uVar1 << 4);
  }
  else {
    iVar4 = (*this->allocator->_vptr_Allocator[2])();
    dst = (TypeBase **)CONCAT44(extraout_var,iVar4);
  }
  this->data = dst;
  NULLC::fillMemory(dst,0,(ulong)this->bucketCount << 3);
  this->count = 0;
  for (lVar5 = 0; (ulong)uVar1 << 3 != lVar5; lVar5 = lVar5 + 8) {
    if (*(long *)((long)ppTVar2 + lVar5) != 0) {
      insert(this,(TypeBase **)((long)ppTVar2 + lVar5));
    }
  }
  if (ppTVar2 != this->storage) {
    pAVar3 = this->allocator;
    if (pAVar3 != (Allocator *)0x0) {
      (*pAVar3->_vptr_Allocator[3])(pAVar3,ppTVar2);
      return;
    }
    (*(code *)NULLC::dealloc)(ppTVar2);
    return;
  }
  return;
}

Assistant:

void rehash()
	{
		unsigned oldBucketCount = bucketCount;
		Key *oldData = data;

		bucketCount *= 2;

		if(allocator)
			data = (Key*)allocator->alloc(sizeof(Key) * bucketCount);
		else
			data = (Key*)NULLC::alloc(sizeof(Key) * bucketCount);

		NULLC::fillMemory(data, 0, sizeof(Key) * bucketCount);

		count = 0;

		for(unsigned i = 0; i < oldBucketCount; i++)
		{
			Key &item = oldData[i];

			if(item == Key())
				continue;

			insert(item);
		}

		if(oldData != storage)
		{
			if(allocator)
				allocator->dealloc(oldData);
			else
				NULLC::dealloc(oldData);
		}
	}